

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O0

void duckdb::TupleDataTemplatedGather<duckdb::uhugeint_t>
               (TupleDataLayout *layout,Vector *row_locations,idx_t col_idx,
               SelectionVector *scan_sel,idx_t scan_count,Vector *target,SelectionVector *target_sel
               ,optional_ptr<duckdb::Vector,_true> param_8,
               vector<duckdb::TupleDataGatherFunction,_true> *param_9)

{
  bool bVar1;
  const_reference pvVar2;
  idx_t iVar3;
  uchar *entry;
  SelectionVector *in_RCX;
  idx_t in_RDX;
  TupleDataLayout *in_RDI;
  ulong in_R8;
  SelectionVector *in_stack_00000008;
  ValidityBytes row_mask;
  idx_t target_idx;
  uchar **source_row;
  idx_t i;
  value_type offset_in_row;
  idx_t idx_in_entry;
  idx_t entry_idx;
  ValidityMask *target_validity;
  uhugeint_t *target_data;
  uchar **source_locations;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  vector<unsigned_long,_true> *in_stack_ffffffffffffff20;
  TemplatedValidityMask<unsigned_long> *this;
  unsigned_long *ptr;
  TemplatedValidityMask<unsigned_char> *this_00;
  TemplatedValidityMask<unsigned_char> local_b0;
  uhugeint_t local_90;
  idx_t local_80;
  unsigned_long **local_78;
  ulong local_70;
  value_type local_68;
  idx_t local_60;
  idx_t local_58;
  ValidityMask *local_50;
  uhugeint_t *local_48;
  TemplatedValidityMask<unsigned_long> *local_40;
  ulong local_30;
  SelectionVector *local_28;
  idx_t local_20;
  TupleDataLayout *local_10;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_10 = in_RDI;
  local_40 = (TemplatedValidityMask<unsigned_long> *)
             FlatVector::GetData<unsigned_char*>((Vector *)0x1654174);
  local_48 = FlatVector::GetData<duckdb::uhugeint_t>((Vector *)0x1654189);
  local_50 = FlatVector::Validity((Vector *)0x165419e);
  TemplatedValidityMask<unsigned_char>::GetEntryIndex(local_20,&local_58,&local_60);
  TupleDataLayout::GetOffsets(local_10);
  pvVar2 = vector<unsigned_long,_true>::operator[]
                     (in_stack_ffffffffffffff20,
                      CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  local_68 = *pvVar2;
  for (local_70 = 0; local_70 < local_30; local_70 = local_70 + 1) {
    this = local_40;
    iVar3 = SelectionVector::get_index(local_28,local_70);
    local_78 = &this->validity_mask + iVar3;
    local_80 = SelectionVector::get_index(in_stack_00000008,local_70);
    local_90 = Load<duckdb::uhugeint_t>((const_data_ptr_t)((long)*local_78 + local_68));
    local_48[local_80].lower = local_90.lower;
    local_48[local_80].upper = local_90.upper;
    ptr = *local_78;
    TupleDataLayout::ColumnCount((TupleDataLayout *)0x16542a4);
    this_00 = &local_b0;
    TemplatedValidityMask<unsigned_char>::TemplatedValidityMask(this_00,(uchar *)ptr,(idx_t)this);
    entry = TemplatedValidityMask<unsigned_char>::GetValidityEntryUnsafe(this_00,local_58);
    bVar1 = TemplatedValidityMask<unsigned_char>::RowIsValid(entry,&local_60);
    if (!bVar1) {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (this,CONCAT17(bVar1,in_stack_ffffffffffffff18));
    }
    TemplatedValidityMask<unsigned_char>::~TemplatedValidityMask
              ((TemplatedValidityMask<unsigned_char> *)0x1654330);
  }
  return;
}

Assistant:

static void TupleDataTemplatedGather(const TupleDataLayout &layout, Vector &row_locations, const idx_t col_idx,
                                     const SelectionVector &scan_sel, const idx_t scan_count, Vector &target,
                                     const SelectionVector &target_sel, optional_ptr<Vector>,
                                     const vector<TupleDataGatherFunction> &) {
	// Source
	const auto source_locations = FlatVector::GetData<data_ptr_t>(row_locations);

	// Target
	auto target_data = FlatVector::GetData<T>(target);
	auto &target_validity = FlatVector::Validity(target);

	// Precompute mask indexes
	idx_t entry_idx;
	idx_t idx_in_entry;
	ValidityBytes::GetEntryIndex(col_idx, entry_idx, idx_in_entry);

	const auto offset_in_row = layout.GetOffsets()[col_idx];
	for (idx_t i = 0; i < scan_count; i++) {
		const auto &source_row = source_locations[scan_sel.get_index(i)];
		const auto target_idx = target_sel.get_index(i);
		target_data[target_idx] = Load<T>(source_row + offset_in_row);
		ValidityBytes row_mask(source_row, layout.ColumnCount());
		if (!row_mask.RowIsValid(row_mask.GetValidityEntryUnsafe(entry_idx), idx_in_entry)) {
			target_validity.SetInvalid(target_idx);
		}
#ifdef DEBUG
		else {
			TupleDataValueVerify<T>(target.GetType(), target_data[target_idx]);
		}
#endif
	}
}